

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::pushScope(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,ScopeCtx *scope)

{
  undefined8 *puVar1;
  __index_type _Var2;
  iterator __position;
  size_t *psVar3;
  Type type;
  long lVar4;
  mapped_type *this_00;
  _Uninitialized<unsigned_int,_true> local;
  undefined1 *puVar5;
  string_view sVar6;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  Name label;
  __index_type local_68;
  undefined1 local_60 [8];
  Result<unsigned_int> _val;
  
  _local_88 = (undefined1  [16])ScopeCtx::getOriginalLabel(scope);
  if (local_88._8_8_ != (char *)0x0) {
    if ((scope->label).super_IString.str._M_str == (char *)0x0) {
      sVar6 = (string_view)makeFresh(this,(Name)_local_88,0);
      (scope->label).super_IString.str = sVar6;
    }
    this_00 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->labelDepths,(key_type *)local_88);
    local_60._0_4_ =
         (int)((ulong)((long)(this->scopeStack).
                             super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->scopeStack).
                            super__Vector_base<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x45d1745d + 1;
    __position._M_current =
         (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,__position,(uint *)local_60);
    }
    else {
      *__position._M_current = local_60._0_4_;
      (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  psVar3 = this->binaryPos;
  if (psVar3 != (size_t *)0x0) {
    scope->startPos = this->lastBinaryPos;
    this->lastBinaryPos = *psVar3;
  }
  type.id = (scope->inputType).id;
  local._M_storage = scope->inputLocal;
  if (type.id == 0) {
LAB_00ca2e41:
    std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
    emplace_back<wasm::IRBuilder::ScopeCtx>(&this->scopeStack,scope);
    if (type.id != 0) {
      makeLocalGet((Result<wasm::Ok> *)local_88,this,local._M_storage);
      if (local_68 == '\x01') {
        local_60 = (undefined1  [8])
                   ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                           super__Move_assign_alias<unsigned_int,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_60,local_88,label.super_IString.str._M_len + (long)local_88);
        goto LAB_00ca2e87;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  }
  else {
    _Var2 = *(__index_type *)
             ((long)&(scope->scope).
                     super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                     .
                     super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                     .
                     super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                     .
                     super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                     .
                     super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                     .
                     super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
             + 0x18);
    lVar4 = *(long *)&(scope->scope).
                      super__Variant_base<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                      .
                      super__Move_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                      .
                      super__Copy_assign_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                      .
                      super__Move_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                      .
                      super__Copy_ctor_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
                      .
                      super__Variant_storage_alias<wasm::IRBuilder::ScopeCtx::NoScope,_wasm::IRBuilder::ScopeCtx::FuncScope,_wasm::IRBuilder::ScopeCtx::BlockScope,_wasm::IRBuilder::ScopeCtx::IfScope,_wasm::IRBuilder::ScopeCtx::ElseScope,_wasm::IRBuilder::ScopeCtx::LoopScope,_wasm::IRBuilder::ScopeCtx::TryScope,_wasm::IRBuilder::ScopeCtx::CatchScope,_wasm::IRBuilder::ScopeCtx::CatchAllScope,_wasm::IRBuilder::ScopeCtx::TryTableScope>
    ;
    if (((_Var2 == '\a' || _Var2 == '\x04') && lVar4 != 0) || (_Var2 == '\b' && lVar4 != 0))
    goto LAB_00ca2e41;
    if (local._M_storage == 0xffffffff) {
      addScratchLocal((Result<unsigned_int> *)local_88,this,type);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_int,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_60,
                 (_Copy_ctor_base<false,_unsigned_int,_wasm::Err> *)local_88);
      _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._39_1_ =
           _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,local_60,
                   _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                   super__Move_assign_alias<unsigned_int,_wasm::Err>.
                   super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                   super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                   super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ + (long)local_60
                  );
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
        if (local_a8 == &local_98) {
          *puVar1 = CONCAT71(uStack_97,local_98);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_90;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_a8;
          *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
               CONCAT71(uStack_97,local_98);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_a0;
        local_a0 = 0;
        local_98 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        local_a8 = &local_98;
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_60);
        local._M_storage = 0xffffffff;
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_60);
        scope->inputLocal = local_88._0_4_;
        local._M_storage = local_88._0_4_;
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)local_88);
      if (_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
          super__Move_assign_alias<unsigned_int,_wasm::Err>.
          super__Copy_assign_alias<unsigned_int,_wasm::Err>.
          super__Move_ctor_alias<unsigned_int,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
          super__Variant_storage_alias<unsigned_int,_wasm::Err>._39_1_ == '\x01') {
        return __return_storage_ptr__;
      }
    }
    makeLocalSet((Result<wasm::Ok> *)local_88,this,local._M_storage);
    if (local_68 != '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
      goto LAB_00ca2e41;
    }
    local_60 = (undefined1  [8])
               ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                       super__Move_assign_alias<unsigned_int,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,local_88,label.super_IString.str._M_len + (long)local_88);
LAB_00ca2e87:
    puVar5 = (undefined1 *)
             ((long)&_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                     super__Move_assign_alias<unsigned_int,_wasm::Err>.
                     super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                     super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                     super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 8);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if (local_60 == (undefined1  [8])puVar5) {
      *puVar1 = CONCAT71(_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._9_7_,
                         _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                         super__Move_assign_alias<unsigned_int,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
           _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
           super__Move_assign_alias<unsigned_int,_wasm::Err>.
           super__Copy_assign_alias<unsigned_int,_wasm::Err>.
           super__Move_ctor_alias<unsigned_int,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
           super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_60;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._9_7_,
                    _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                    super__Move_assign_alias<unsigned_int,_wasm::Err>.
                    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                    super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) =
         _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
         super__Move_assign_alias<unsigned_int,_wasm::Err>.
         super__Copy_assign_alias<unsigned_int,_wasm::Err>.
         super__Move_ctor_alias<unsigned_int,_wasm::Err>.
         super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
         super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_;
    _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._0_8_ = 0;
    _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
    super__Move_assign_alias<unsigned_int,_wasm::Err>.
    super__Copy_assign_alias<unsigned_int,_wasm::Err>.
    super__Move_ctor_alias<unsigned_int,_wasm::Err>.super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
    super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_u._8_1_ = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    local_60 = (undefined1  [8])puVar5;
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> pushScope(ScopeCtx&& scope) {
    if (auto label = scope.getOriginalLabel()) {
      // Assign a fresh label to the scope, if necessary.
      if (!scope.label) {
        scope.label = makeFresh(label);
      }
      // Record the original label to handle references to it correctly.
      labelDepths[label].push_back(scopeStack.size() + 1);
    }
    if (binaryPos) {
      scope.startPos = lastBinaryPos;
      lastBinaryPos = *binaryPos;
    }
    bool hasInput = scope.inputType != Type::none;
    Index inputLocal = scope.inputLocal;
    if (hasInput && !scope.isDelimiter()) {
      if (inputLocal == Index(-1)) {
        auto scratch = addScratchLocal(scope.inputType);
        CHECK_ERR(scratch);
        inputLocal = scope.inputLocal = *scratch;
      }
      CHECK_ERR(makeLocalSet(inputLocal));
    }
    scopeStack.emplace_back(std::move(scope));
    if (hasInput) {
      CHECK_ERR(makeLocalGet(inputLocal));
    }
    return Ok{};
  }